

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

void __thiscall
dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>>::emplace<dg::vr::Bucket&>
          (VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *this,Bucket *vals)

{
  bool bVar1;
  vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
  *in_RSI;
  reference_wrapper<dg::vr::Bucket> *in_RDI;
  reference_wrapper<dg::vr::Bucket> val;
  Bucket *in_stack_ffffffffffffffd8;
  reference_wrapper<dg::vr::Bucket> *in_stack_ffffffffffffffe8;
  
  std::reference_wrapper<dg::vr::Bucket>::reference_wrapper<dg::vr::Bucket&,void,dg::vr::Bucket*>
            (in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = contains<std::reference_wrapper<dg::vr::Bucket>>
                    ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)in_RSI,
                     in_stack_ffffffffffffffe8);
  if (!bVar1) {
    std::
    vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
    ::emplace_back<std::reference_wrapper<dg::vr::Bucket>>(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }